

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_short,short>::
Update<duckdb::BitpackingCompressionState<unsigned_short,true,short>::BitpackingWriter>
          (BitpackingState<unsigned_short,short> *this,unsigned_short value,bool is_valid)

{
  long lVar1;
  bool bVar2;
  ushort uVar3;
  
  lVar1 = *(long *)(this + 0x2810);
  this[lVar1 + 0x2010] = (BitpackingState<unsigned_short,short>)is_valid;
  this[0x2836] = (BitpackingState<unsigned_short,short>)((byte)this[0x2836] & is_valid);
  this[0x2837] = (BitpackingState<unsigned_short,short>)((byte)this[0x2837] & !is_valid);
  if (is_valid) {
    *(unsigned_short *)(*(long *)(this + 0x1008) + lVar1 * 2) = value;
    uVar3 = (ushort)*(undefined4 *)(this + 0x2828);
    if (value <= (ushort)*(undefined4 *)(this + 0x2828)) {
      uVar3 = value;
    }
    *(ushort *)(this + 0x2828) = uVar3;
    uVar3 = *(ushort *)(this + 0x282a);
    if (*(ushort *)(this + 0x282a) <= value) {
      uVar3 = value;
    }
    *(ushort *)(this + 0x282a) = uVar3;
  }
  *(long *)(this + 0x2810) = lVar1 + 1;
  if (lVar1 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<unsigned_short,true,short>::BitpackingWriter>
                      (this);
    *(undefined2 *)(this + 0x2828) = 0xffff;
    *(undefined2 *)(this + 0x282e) = 0x7fff;
    *(undefined4 *)(this + 0x282a) = 0;
    *(undefined4 *)(this + 0x2830) = 0x8000;
    *(undefined2 *)(this + 0x2834) = 0;
    *(undefined4 *)(this + 0x2836) = 0x101;
    *(undefined8 *)(this + 0x2810) = 0;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}